

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Renderbuffers::StorageMultisampleTest::PrepareRenderbuffer
          (StorageMultisampleTest *this,RenderbufferInternalFormatConfiguration format,GLuint width,
          GLuint height,GLsizei samples)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  Enum<int,_2UL> EVar7;
  GLsizei local_674;
  GLsizei local_53c;
  GetNameFunc local_538;
  int local_530;
  Enum<int,_2UL> local_528;
  MessageBuilder local_518;
  int local_394;
  GetNameFunc p_Stack_390;
  GLenum status;
  int local_388;
  Enum<int,_2UL> local_380;
  MessageBuilder local_370;
  int local_1f0;
  int local_1ec;
  GLenum error_1;
  int local_1e0;
  Enum<int,_2UL> local_1d8 [2];
  MessageBuilder local_1b8;
  int local_38;
  uint local_34;
  GLenum error;
  GLuint i;
  Functions *gl;
  GLuint local_20;
  GLsizei samples_local;
  GLuint height_local;
  GLuint width_local;
  StorageMultisampleTest *this_local;
  
  gl._4_4_ = samples;
  local_20 = height;
  samples_local = width;
  _height_local = this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  _error = CONCAT44(extraout_var,iVar1);
  (**(code **)(_error + 0x6d0))(2,this->m_fbo);
  dVar2 = (**(code **)(_error + 0x800))();
  glu::checkError(dVar2,"glGenFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x2154);
  (**(code **)(_error + 0x3e0))(2,this->m_rbo);
  dVar2 = (**(code **)(_error + 0x800))();
  glu::checkError(dVar2,"glCreateRenderbuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x2157);
  local_34 = 0;
  while( true ) {
    if (1 < local_34) {
      return true;
    }
    (**(code **)(_error + 0x78))(0x8d40,this->m_fbo[local_34]);
    dVar2 = (**(code **)(_error + 0x800))();
    glu::checkError(dVar2,"glBindFramebuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x215c);
    if (local_34 == 0) {
      (**(code **)(_error + 0xfb0))
                (this->m_rbo[0],gl._4_4_,format.internalformat,samples_local,local_20);
      local_1f0 = (**(code **)(_error + 0x800))();
      if (local_1f0 != 0) {
        pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar5 = tcu::TestContext::getLog(pTVar4);
        tcu::TestLog::operator<<(&local_370,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_370,
                            (char (*) [100])
                            "Renderbuffer storage multisample test failed because NamedRenderbufferStorageMultisample generated "
                           );
        EVar7 = glu::getErrorStr(local_1f0);
        p_Stack_390 = EVar7.m_getName;
        local_388 = EVar7.m_value;
        local_380.m_getName = p_Stack_390;
        local_380.m_value = local_388;
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_380);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(char (*) [40])" error value. Renderbuffers format was ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&format.internalformat_name);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])", samples was ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)((long)&gl + 4));
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [13])", width was ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)&samples_local);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [14])", height was ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_20);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b5e49a);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_370);
        return false;
      }
      local_1f0 = 0;
    }
    else {
      (**(code **)(_error + 0xfb0))
                (this->m_rbo[local_34],0,format.internalformat,samples_local,local_20);
      local_38 = (**(code **)(_error + 0x800))();
      if (local_38 != 0) {
        pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar5 = tcu::TestContext::getLog(pTVar4);
        tcu::TestLog::operator<<(&local_1b8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_1b8,
                            (char (*) [100])
                            "Renderbuffer storage multisample test failed because NamedRenderbufferStorageMultisample generated "
                           );
        EVar7 = glu::getErrorStr(local_38);
        _error_1 = EVar7.m_getName;
        local_1e0 = EVar7.m_value;
        local_1d8[0].m_getName = _error_1;
        local_1d8[0].m_value = local_1e0;
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_1d8);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(char (*) [40])" error value. Renderbuffers format was ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&format.internalformat_name);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])", samples was ");
        local_1ec = 0;
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1ec);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [13])", width was ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)&samples_local);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [14])", height was ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_20);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b5e49a);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1b8);
        return false;
      }
      local_38 = 0;
    }
    if ((((((undefined1  [24])format & (undefined1  [24])0x1) != (undefined1  [24])0x0) ||
         (((undefined1  [24])format & (undefined1  [24])0x100) != (undefined1  [24])0x0)) ||
        (((undefined1  [24])format & (undefined1  [24])0x10000) != (undefined1  [24])0x0)) ||
       (((undefined1  [24])format & (undefined1  [24])0x1000000) != (undefined1  [24])0x0)) {
      (**(code **)(_error + 0xf10))(this->m_fbo[local_34],0x8ce0,0x8d41,this->m_rbo[local_34]);
    }
    if (((undefined1  [24])format & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
      (**(code **)(_error + 0xf10))(this->m_fbo[local_34],0x8d00,0x8d41,this->m_rbo[local_34]);
    }
    if (((undefined1  [24])format & (undefined1  [24])0x10000000000) != (undefined1  [24])0x0) {
      (**(code **)(_error + 0xf10))(this->m_fbo[local_34],0x8d20,0x8d41,this->m_rbo[local_34]);
    }
    local_394 = (**(code **)(_error + 0x170))(0x8d40);
    if (local_394 != 0x8cd5) break;
    local_34 = local_34 + 1;
    local_394 = 0x8cd5;
  }
  pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  pTVar5 = tcu::TestContext::getLog(pTVar4);
  tcu::TestLog::operator<<(&local_518,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_518,
                      (char (*) [53])"Renderbuffer storage multisample test failed due to ");
  EVar7 = glu::getFramebufferStatusStr(local_394);
  local_538 = EVar7.m_getName;
  local_530 = EVar7.m_value;
  local_528.m_getName = local_538;
  local_528.m_value = local_530;
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_528);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [47])0x2a6d01e);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&format.internalformat_name);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])", samples was ");
  if (local_34 == 0) {
    local_674 = gl._4_4_;
  }
  else {
    local_674 = 0;
  }
  local_53c = local_674;
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_53c);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [13])", width was ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)&samples_local);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [14])", height was ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_20);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b5e49a);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_518);
  return false;
}

Assistant:

bool StorageMultisampleTest::PrepareRenderbuffer(StorageMultisampleTest::RenderbufferInternalFormatConfiguration format,
												 glw::GLuint width, glw::GLuint height, glw::GLsizei samples)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genFramebuffers(2, m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

	gl.createRenderbuffers(2, m_rbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateRenderbuffers call failed.");

	for (glw::GLuint i = 0; i < 2; ++i)
	{
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

		if (i)
		{
			/* 2nd is not multisampled. */
			gl.namedRenderbufferStorageMultisample(m_rbo[i], 0, format.internalformat, width, height);

			if (glw::GLenum error = gl.getError())
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Renderbuffer storage multisample test failed because "
												"NamedRenderbufferStorageMultisample generated "
					<< glu::getErrorStr(error) << " error value. Renderbuffers format was "
					<< format.internalformat_name << ", samples was " << 0 << ", width was " << width << ", height was "
					<< height << "." << tcu::TestLog::EndMessage;
				return false;
			}
		}
		else
		{
			/* 1st is multisampled. */
			gl.namedRenderbufferStorageMultisample(m_rbo[i], samples, format.internalformat, width, height);

			if (glw::GLenum error = gl.getError())
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Renderbuffer storage multisample test failed because "
												"NamedRenderbufferStorageMultisample generated "
					<< glu::getErrorStr(error) << " error value. Renderbuffers format was "
					<< format.internalformat_name << ", samples was " << samples << ", width was " << width
					<< ", height was " << height << "." << tcu::TestLog::EndMessage;
				return false;
			}
		}

		if (format.hasRedComponent || format.hasGreenComponent || format.hasBlueComponent || format.hasAlphaComponent)
		{
			gl.namedFramebufferRenderbuffer(m_fbo[i], GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_rbo[i]);
		}

		if (format.hasDepthComponent)
		{
			gl.namedFramebufferRenderbuffer(m_fbo[i], GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, m_rbo[i]);
		}

		if (format.hasStencilComponent)
		{
			gl.namedFramebufferRenderbuffer(m_fbo[i], GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, m_rbo[i]);
		}

		glw::GLenum status = gl.checkFramebufferStatus(GL_FRAMEBUFFER);
		if (status != GL_FRAMEBUFFER_COMPLETE)
		{
			/* Log. */
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Renderbuffer storage multisample test failed due to "
				<< glu::getFramebufferStatusStr(status) << " framebuffer status. Renderbuffers format was "
				<< format.internalformat_name << ", samples was " << (i ? 0 : samples) << ", width was " << width
				<< ", height was " << height << "." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}